

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O1

uint32_t FAudioFXReverb_LockForProcess
                   (FAudioFXReverb *fapo,uint32_t InputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pInputLockedParameters,
                   uint32_t OutputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pOutputLockedParameters)

{
  size_t sVar1;
  uint16_t uVar2;
  ushort uVar3;
  FAudioWaveFormatEx *pFVar4;
  FAudioWaveFormatEx *pFVar5;
  FAudioMallocFunc p_Var6;
  DspReverbChannel *pDVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  FAudio_ChannelPositionFlags FVar12;
  uint32_t uVar13;
  float *pfVar14;
  ushort uVar15;
  DspCombShelving *pDVar16;
  uint uVar17;
  DspCombShelving *pDVar18;
  DspAllPass *pDVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined1 auVar35 [16];
  DspAllPass *local_a0;
  
  uVar2 = pInputLockedParameters->pFormat->wFormatTag;
  if (((uVar2 == 3) ||
      ((uVar2 == 0xfffe &&
       (iVar8 = SDL_memcmp((undefined1 *)
                           ((long)&pInputLockedParameters->pFormat[1].nSamplesPerSec + 2),
                           IsFloatFormat_KSDATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10), iVar8 == 0)))) &&
     (pFVar4 = pInputLockedParameters->pFormat, 0xffff929e < pFVar4->nSamplesPerSec - 0xbb81)) {
    uVar3 = pFVar4->nChannels;
    if (uVar3 == 6) {
      uVar15 = pOutputLockedParameters->pFormat->nChannels;
    }
    else if (uVar3 == 2) {
      uVar15 = pOutputLockedParameters->pFormat->nChannels | 4;
    }
    else {
      if (uVar3 != 1) {
        return 0x88970001;
      }
      uVar15 = pOutputLockedParameters->pFormat->nChannels;
      if (uVar15 == 1) goto LAB_001169a7;
    }
    if (uVar15 == 6) {
LAB_001169a7:
      fapo->inChannels = uVar3;
      pFVar5 = pOutputLockedParameters->pFormat;
      uVar17 = (uint)pFVar5->nChannels;
      fapo->outChannels = pFVar5->nChannels;
      uVar13 = pFVar5->nSamplesPerSec;
      fapo->sampleRate = uVar13;
      fapo->inBlockAlign = pFVar4->nBlockAlign;
      fapo->outBlockAlign = pFVar5->nBlockAlign;
      p_Var6 = (fapo->base).pMalloc;
      SDL_memset(&fapo->reverb,0,0x17e0);
      (fapo->reverb).early_delay.sampleRate = uVar13;
      fVar22 = (float)(int)uVar13;
      auVar27._0_4_ = fVar22 * 300.0;
      auVar27._4_4_ = fVar22 * 10.0;
      auVar27._8_4_ = fVar22 * 0.0;
      auVar27._12_4_ = fVar22 * 0.0;
      auVar28 = divps(auVar27,_DAT_00126970);
      iVar8 = (int)auVar28._0_4_;
      iVar30 = (int)auVar28._4_4_;
      iVar31 = (int)auVar28._8_4_;
      iVar32 = (int)auVar28._12_4_;
      auVar33._0_4_ = iVar8 >> 0x1f;
      auVar33._4_4_ = iVar30 >> 0x1f;
      auVar33._8_4_ = iVar31 >> 0x1f;
      auVar33._12_4_ = iVar32 >> 0x1f;
      auVar35._0_4_ = (int)(auVar28._0_4_ - 2.1474836e+09);
      auVar35._4_4_ = (int)(auVar28._4_4_ - 2.1474836e+09);
      auVar35._8_4_ = (int)(auVar28._8_4_ - 2.1474836e+09);
      auVar35._12_4_ = (int)(auVar28._12_4_ - 2.1474836e+09);
      auVar28._4_4_ = iVar30;
      auVar28._0_4_ = iVar8;
      auVar28._8_4_ = iVar31;
      auVar28._12_4_ = iVar32;
      auVar28 = auVar35 & auVar33 | auVar28;
      uVar9 = auVar28._0_4_;
      uVar34 = auVar28._0_8_;
      (fapo->reverb).early_delay.capacity = (int)uVar34;
      (fapo->reverb).early_delay.delay = (int)((ulong)uVar34 >> 0x20);
      (fapo->reverb).early_delay.read_idx = 0;
      (fapo->reverb).early_delay.write_idx = auVar28._4_4_;
      sVar1 = (ulong)uVar9 * 4;
      pfVar14 = (float *)(*p_Var6)(sVar1);
      (fapo->reverb).early_delay.buffer = pfVar14;
      SDL_memset(pfVar14,0,(ulong)(fapo->reverb).early_delay.capacity << 2);
      (fapo->reverb).apf_in[0].delay.sampleRate = uVar13;
      (fapo->reverb).apf_in[0].delay.capacity = uVar9;
      uVar10 = (uint32_t)(long)((fVar22 * 13.28) / 1000.0);
      (fapo->reverb).apf_in[0].delay.delay = uVar10;
      (fapo->reverb).apf_in[0].delay.read_idx = 0;
      (fapo->reverb).apf_in[0].delay.write_idx = uVar10;
      pfVar14 = (float *)(*p_Var6)(sVar1);
      (fapo->reverb).apf_in[0].delay.buffer = pfVar14;
      SDL_memset(pfVar14,0,(ulong)(fapo->reverb).apf_in[0].delay.capacity << 2);
      (fapo->reverb).apf_in[0].feedback_gain = 0.5;
      uVar11 = uVar3 == 6 | 4;
      if (uVar17 != 6) {
        uVar11 = uVar17;
      }
      (fapo->reverb).reverb_channels = uVar11;
      if (uVar11 != 0) {
        dVar24 = (double)((31415.928 / fVar22) * 0.5);
        pDVar16 = (fapo->reverb).channel[0].lpf_comb;
        local_a0 = (fapo->reverb).channel[0].apf_out;
        lVar20 = 0;
        do {
          (fapo->reverb).channel[lVar20].reverb_delay.sampleRate = uVar13;
          pDVar7 = (fapo->reverb).channel + lVar20;
          (pDVar7->reverb_delay).capacity = (int)uVar34;
          (pDVar7->reverb_delay).delay = (int)((ulong)uVar34 >> 0x20);
          (fapo->reverb).channel[lVar20].reverb_delay.read_idx = 0;
          (fapo->reverb).channel[lVar20].reverb_delay.write_idx = auVar28._4_4_;
          pfVar14 = (float *)(*p_Var6)(sVar1);
          (fapo->reverb).channel[lVar20].reverb_delay.buffer = pfVar14;
          SDL_memset(pfVar14,0,(ulong)(fapo->reverb).channel[lVar20].reverb_delay.capacity << 2);
          lVar21 = 0;
          pDVar18 = pDVar16;
          do {
            FVar12 = FAudio_GetChannelPositionFlags((fapo->reverb).reverb_channels,(int32_t)lVar20);
            fVar23 = 0.0;
            if ((FVar12 & Position_Right) != 0) {
              fVar23 = 0.5216;
            }
            fVar29 = *(float *)((long)COMB_DELAYS + lVar21);
            (pDVar18->comb_delay).sampleRate = uVar13;
            (pDVar18->comb_delay).capacity = uVar9;
            uVar10 = (uint32_t)(long)(((fVar23 + fVar29) * fVar22) / 1000.0);
            (pDVar18->comb_delay).delay = uVar10;
            (pDVar18->comb_delay).read_idx = 0;
            (pDVar18->comb_delay).write_idx = uVar10;
            pfVar14 = (float *)(*p_Var6)(sVar1);
            (pDVar18->comb_delay).buffer = pfVar14;
            SDL_memset(pfVar14,0,(ulong)(pDVar18->comb_delay).capacity << 2);
            dVar25 = (double)SDL_pow(0x4024000000000000,
                                     SUB84((double)(((float)(pDVar18->comb_delay).delay * -3.0 *
                                                    1000.0) /
                                                   ((float)(pDVar18->comb_delay).sampleRate * 500.0)
                                                   ),0));
            pDVar18->comb_feedback_gain = (float)dVar25;
            (pDVar18->low_shelving).sampleRate = uVar13;
            (pDVar18->low_shelving).delay0 = 0.0;
            (pDVar18->low_shelving).delay1 = 0.0;
            dVar25 = (double)SDL_pow(0x4024000000000000,0x40000000);
            dVar26 = (double)SDL_tan((double)((3141.5928 / fVar22) * 0.5));
            fVar23 = (float)dVar26 * (4.0 / ((float)dVar25 + 1.0));
            fVar29 = (1.0 - fVar23) / (fVar23 + 1.0);
            fVar23 = (1.0 - fVar29) * 0.5;
            (pDVar18->low_shelving).a0 = fVar23;
            (pDVar18->low_shelving).a1 = fVar23;
            (pDVar18->low_shelving).a2 = 0.0;
            (pDVar18->low_shelving).b1 = -fVar29;
            (pDVar18->low_shelving).b2 = 0.0;
            (pDVar18->low_shelving).c0 = (float)dVar25 + -1.0;
            (pDVar18->low_shelving).d0 = 1.0;
            (pDVar18->high_shelving).sampleRate = uVar13;
            (pDVar18->high_shelving).delay0 = 0.0;
            (pDVar18->high_shelving).delay1 = 0.0;
            dVar25 = (double)SDL_pow(0x4024000000000000,0x40000000);
            dVar26 = (double)SDL_tan(dVar24);
            fVar23 = (float)dVar26 * ((float)dVar25 + 1.0) * 0.25;
            fVar29 = (1.0 - fVar23) / (fVar23 + 1.0);
            fVar23 = (fVar29 + 1.0) * 0.5;
            (pDVar18->high_shelving).a0 = fVar23;
            (pDVar18->high_shelving).a1 = -fVar23;
            (pDVar18->high_shelving).a2 = 0.0;
            (pDVar18->high_shelving).b1 = -fVar29;
            (pDVar18->high_shelving).b2 = 0.0;
            (pDVar18->high_shelving).c0 = (float)dVar25 + -1.0;
            (pDVar18->high_shelving).d0 = 1.0;
            lVar21 = lVar21 + 4;
            pDVar18 = pDVar18 + 1;
          } while (lVar21 != 0x20);
          lVar21 = 0;
          pDVar19 = local_a0;
          do {
            FVar12 = FAudio_GetChannelPositionFlags((fapo->reverb).reverb_channels,(int32_t)lVar20);
            fVar23 = 0.0;
            if ((FVar12 & Position_Right) != 0) {
              fVar23 = 0.5216;
            }
            fVar29 = *(float *)((long)APF_OUT_DELAYS + lVar21);
            (pDVar19->delay).sampleRate = uVar13;
            (pDVar19->delay).capacity = uVar9;
            uVar10 = (uint32_t)(long)(((fVar23 + fVar29) * fVar22) / 1000.0);
            (pDVar19->delay).delay = uVar10;
            (pDVar19->delay).read_idx = 0;
            (pDVar19->delay).write_idx = uVar10;
            pfVar14 = (float *)(*p_Var6)(sVar1);
            (pDVar19->delay).buffer = pfVar14;
            SDL_memset(pfVar14,0,(ulong)(pDVar19->delay).capacity << 2);
            pDVar19->feedback_gain = 0.5;
            lVar21 = lVar21 + 4;
            pDVar19 = pDVar19 + 1;
          } while (lVar21 != 0x10);
          (fapo->reverb).channel[lVar20].room_high_shelf.sampleRate = uVar13;
          pDVar7 = (fapo->reverb).channel + lVar20;
          (pDVar7->room_high_shelf).delay0 = 0.0;
          (pDVar7->room_high_shelf).delay1 = 0.0;
          dVar25 = (double)SDL_pow(0x4024000000000000,0);
          dVar26 = (double)SDL_tan(dVar24);
          fVar23 = (float)dVar26 * ((float)dVar25 + 1.0) * 0.25;
          fVar29 = (1.0 - fVar23) / (fVar23 + 1.0);
          fVar23 = (fVar29 + 1.0) * 0.5;
          (fapo->reverb).channel[lVar20].room_high_shelf.a0 = fVar23;
          (fapo->reverb).channel[lVar20].room_high_shelf.a1 = -fVar23;
          (fapo->reverb).channel[lVar20].room_high_shelf.a2 = 0.0;
          (fapo->reverb).channel[lVar20].room_high_shelf.b1 = -fVar29;
          (fapo->reverb).channel[lVar20].room_high_shelf.b2 = 0.0;
          (fapo->reverb).channel[lVar20].room_high_shelf.c0 = (float)dVar25 + -1.0;
          (fapo->reverb).channel[lVar20].room_high_shelf.d0 = 1.0;
          (fapo->reverb).channel[lVar20].gain = 1.0;
          lVar20 = lVar20 + 1;
          pDVar16 = pDVar16 + 10;
          local_a0 = local_a0 + 0x1e;
        } while (lVar20 < (fapo->reverb).reverb_channels);
      }
      (fapo->reverb).early_gain = 1.0;
      (fapo->reverb).reverb_gain = 1.0;
      (fapo->reverb).wet_ratio = 1.0;
      (fapo->reverb).dry_ratio = 0.0;
      (fapo->reverb).in_channels = (uint)uVar3;
      (fapo->reverb).out_channels = uVar17;
      uVar13 = FAPOBase_LockForProcess
                         (&fapo->base,InputLockedParameterCount,pInputLockedParameters,
                          OutputLockedParameterCount,pOutputLockedParameters);
      return uVar13;
    }
  }
  return 0x88970001;
}

Assistant:

uint32_t FAudioFXReverb_LockForProcess(
	FAudioFXReverb *fapo,
	uint32_t InputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pInputLockedParameters,
	uint32_t OutputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pOutputLockedParameters
) {
	/* Reverb specific validation */
	if (!IsFloatFormat(pInputLockedParameters->pFormat))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (	pInputLockedParameters->pFormat->nSamplesPerSec < FAUDIOFX_REVERB_MIN_FRAMERATE ||
		pInputLockedParameters->pFormat->nSamplesPerSec > FAUDIOFX_REVERB_MAX_FRAMERATE	)
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (!(	(pInputLockedParameters->pFormat->nChannels == 1 &&
			(pOutputLockedParameters->pFormat->nChannels == 1 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 2 &&
			(pOutputLockedParameters->pFormat->nChannels == 2 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 6 &&
			pOutputLockedParameters->pFormat->nChannels == 6)))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	/* Save the things we care about */
	fapo->inChannels = pInputLockedParameters->pFormat->nChannels;
	fapo->outChannels = pOutputLockedParameters->pFormat->nChannels;
	fapo->sampleRate = pOutputLockedParameters->pFormat->nSamplesPerSec;
	fapo->inBlockAlign = pInputLockedParameters->pFormat->nBlockAlign;
	fapo->outBlockAlign = pOutputLockedParameters->pFormat->nBlockAlign;

	/* Create the network */
	DspReverb_Create(
		&fapo->reverb,
		fapo->sampleRate,
		fapo->inChannels,
		fapo->outChannels,
		fapo->base.pMalloc
	);

	/* Call	parent to do basic validation */
	return FAPOBase_LockForProcess(
		&fapo->base,
		InputLockedParameterCount,
		pInputLockedParameters,
		OutputLockedParameterCount,
		pOutputLockedParameters
	);
}